

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_exception.cpp
# Opt level: O2

void __thiscall
BmsParseInvalidRandomValueException::BmsParseInvalidRandomValueException
          (BmsParseInvalidRandomValueException *this,uint line,string *key,string *value)

{
  (this->super_BmsParseException).line_ = line;
  (this->super_BmsParseException).super_BmsException._vptr_BmsException =
       (_func_int **)&PTR_Message_abi_cxx11__001445d8;
  std::__cxx11::string::string((string *)&this->key_,(string *)key);
  std::__cxx11::string::string((string *)&this->value_,(string *)value);
  return;
}

Assistant:

BmsParseInvalidRandomValueException::BmsParseInvalidRandomValueException( unsigned int line,
                                                                          const std::string& key,
                                                                          const std::string& value ) :
BmsParseException( line ),
key_( key ),
value_( value )
{
}